

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::hasAdditionalOps(string *unit_string)

{
  long lVar1;
  size_type sVar2;
  size_type sVar3;
  size_type __pos;
  size_type __pos_00;
  bool bVar4;
  
  if (unit_string->_M_string_length == 0) {
LAB_003ac774:
    __pos = 0xffffffffffffffff;
  }
  else {
    sVar2 = unit_string->_M_string_length;
    do {
      __pos = sVar2 - 1;
      if (sVar2 == 0) goto LAB_003ac774;
      lVar1 = sVar2 - 1;
      sVar2 = __pos;
    } while ((unit_string->_M_dataplus)._M_p[lVar1] != '{');
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(unit_string,"*^(/",__pos,4);
  bVar4 = true;
  if (sVar2 == 0xffffffffffffffff) {
    if (unit_string->_M_string_length == 0) {
LAB_003ac7bb:
      __pos_00 = 0xffffffffffffffff;
    }
    else {
      sVar3 = unit_string->_M_string_length;
      do {
        __pos_00 = sVar3 - 1;
        if (sVar3 == 0) goto LAB_003ac7bb;
        lVar1 = sVar3 - 1;
        sVar3 = __pos_00;
      } while ((unit_string->_M_dataplus)._M_p[lVar1] != '}');
    }
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unit_string,"*^(/",__pos_00,4);
    bVar4 = sVar3 != 0xffffffffffffffff;
  }
  return bVar4;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}